

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverBranchAndBound.h
# Opt level: O0

Index __thiscall
BGIP_SolverBranchAndBound<JointPolicyPureVector>::GetDepthFirstSpecified
          (BGIP_SolverBranchAndBound<JointPolicyPureVector> *this,Index agentI,Index typeI,
          BGIP_BnB_NodePtr *node)

{
  const_reference this_00;
  const_reference pvVar1;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  
  this_00 = std::
            vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                          *)(in_RDI + 0x188),(ulong)in_ESI);
  pvVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (this_00,(ulong)in_EDX);
  return *pvVar1;
}

Assistant:

Index GetDepthFirstSpecified(Index agentI, Index typeI, 
                                 BGIP_BnB_NodePtr node) const 
        {
#if DYNAMIC_JT_INDEX_MAPPING
            if(_m_reComputeJTIndexMapping)
                return(node->GetDepthFirstSpecified(agentI,typeI));
            else
#endif
                return(_m_depthFirstSpecified[agentI][typeI]);
        }